

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ObjTerSimGet0Fanin0(Gia_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (uint)*(undefined8 *)pObj;
  if (((uVar2 >> 0x1d & 1) != 0) &&
     ((*(ulong *)(pObj + -(ulong)(uVar2 & 0x1fffffff)) & 0x4000000040000000) == 0x4000000000000000))
  {
    return 1;
  }
  uVar1 = 0;
  if ((*(ulong *)(pObj + -(ulong)(uVar2 & 0x1fffffff)) & 0x4000000040000000) == 0x40000000) {
    uVar1 = (uint)((uVar2 >> 0x1d & 1) == 0);
  }
  return uVar1;
}

Assistant:

static inline int  Gia_ObjTerSimGet0Fanin0( Gia_Obj_t * pObj ) { return (Gia_ObjTerSimGet1(Gia_ObjFanin0(pObj)) && Gia_ObjFaninC0(pObj)) || (Gia_ObjTerSimGet0(Gia_ObjFanin0(pObj)) && !Gia_ObjFaninC0(pObj)); }